

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlist.c
# Opt level: O3

dlist_t * dlist_ins_after(dlist_head_t *head,dlist_t *dlist,void *data)

{
  dlist_s *pdVar1;
  dlist_t *pdVar2;
  
  if (head == (dlist_head_t *)0x0) {
    __assert_fail("head != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/dlist.c",0x8d,
                  "dlist_t *dlist_ins_after(dlist_head_t *, dlist_t *, void *)");
  }
  if (dlist != (dlist_t *)0x0) {
    pdVar2 = (dlist_t *)malloc(0x18);
    if (pdVar2 != (dlist_t *)0x0) {
      pdVar2->data = data;
      pdVar1 = dlist->next;
      pdVar2->next = pdVar1;
      if (pdVar1 != (dlist_s *)0x0) {
        pdVar1->prev = pdVar2;
      }
      dlist->next = pdVar2;
      pdVar2->prev = dlist;
      if (head->end == dlist) {
        head->end = pdVar2;
      }
      head->num = head->num + 1;
    }
    return pdVar2;
  }
  __assert_fail("dlist != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/dlist.c",0x8e,
                "dlist_t *dlist_ins_after(dlist_head_t *, dlist_t *, void *)");
}

Assistant:

dlist_t *dlist_ins_after(dlist_head_t *head, dlist_t *dlist, void *data) {
  assert(head != NULL);
  assert(dlist != NULL);
  
  dlist_t *tmp = dlist_new(data);
  
  if (!tmp)
    return NULL;
  
  if (dlist_insl_after(head, dlist, tmp)) {
    return tmp;
  } else {
    dlist_delete(tmp, NULL);
    return NULL;
  }
}